

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# charconv_bigint.h
# Opt level: O2

uint32_t __thiscall absl::strings_internal::BigUnsigned<4>::DivMod<10u>(BigUnsigned<4> *this)

{
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  
  uVar4 = 0;
  for (uVar3 = (ulong)(uint)this->size_; 0 < (int)uVar3; uVar3 = uVar3 - 1) {
    uVar2 = (ulong)this->words_[uVar3 - 1] | uVar4 << 0x20;
    uVar4 = uVar2 % 10;
    this->words_[uVar3 - 1] = (uint32_t)(uVar2 / 10);
  }
  iVar1 = this->size_;
  while ((0 < iVar1 && (this->words_[iVar1 - 1] == 0))) {
    iVar1 = iVar1 + -1;
    this->size_ = iVar1;
  }
  return (uint32_t)uVar4;
}

Assistant:

uint32_t DivMod() {
    uint64_t accumulator = 0;
    for (int i = size_ - 1; i >= 0; --i) {
      accumulator <<= 32;
      accumulator += words_[i];
      // accumulator / divisor will never overflow an int32_t in this loop
      words_[i] = static_cast<uint32_t>(accumulator / divisor);
      accumulator = accumulator % divisor;
    }
    while (size_ > 0 && words_[size_ - 1] == 0) {
      --size_;
    }
    return static_cast<uint32_t>(accumulator);
  }